

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_atomic(CompilerHLSL *this,uint32_t *ops,uint32_t length,Op op)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint id;
  Variant *pVVar2;
  pointer pcVar3;
  bool bVar4;
  uint32_t uVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  SPIRAccessChain *pSVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  runtime_error *this_00;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint id_00;
  undefined1 *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  BaseType expr_type;
  char *atomic_op;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string value_expr;
  uint32_t result_type;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  atomic_op = (char *)0x0;
  value_expr._M_dataplus._M_p = (pointer)&value_expr.field_2;
  value_expr._M_string_length = 0;
  value_expr.field_2._M_local_buf[0] = '\0';
  uVar9 = (ulong)(op - OpAtomicLoad);
  switch(uVar9) {
  case 0:
switchD_001baa38_caseD_0:
    pcVar11 = "0";
    break;
  case 1:
switchD_001baa38_caseD_1:
    atomic_op = "InterlockedExchange";
    pSVar6 = Compiler::expression_type((Compiler *)this,*ops);
    uVar9 = (ulong)*ops;
    if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar9].type == TypeAccessChain))
    {
      pSVar8 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar9);
    }
    else {
      pSVar8 = (SPIRAccessChain *)0x0;
    }
    pmVar10 = ::std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->super_CompilerGLSL).extra_sub_expressions,ops);
    if (*pmVar10 == 0) {
      uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      *pmVar10 = uVar5;
      pSVar7 = Compiler::get_pointee_type((Compiler *)this,pSVar6);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,(pSVar7->super_IVariant).self.id,*pmVar10);
    }
    if ((pSVar8 == (SPIRAccessChain *)0x0) || (pSVar6->storage == StorageClassImage)) {
      CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,*ops)
      ;
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)&result_type,&this->super_CompilerGLSL,*pmVar10,true);
      CompilerGLSL::
      statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x2d210e,&expr,
                 (char (*) [3])0x2d07c3,&local_90,(char (*) [3])0x2d07c3,(string *)&result_type,
                 (char (*) [3])0x2b977c);
      if ((undefined1 *)CONCAT44(uStack_4c,result_type) != local_40) {
        operator_delete((undefined1 *)CONCAT44(uStack_4c,result_type));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p == &expr.field_2) goto LAB_001bac73;
    }
    else {
      pcVar3 = (pSVar8->base)._M_dataplus._M_p;
      expr._M_dataplus._M_p = (pointer)&expr.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&expr,pcVar3,pcVar3 + (pSVar8->base)._M_string_length);
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationNonUniform)
      ;
      if (bVar4) {
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,&expr,(pSVar8->super_IVariant).self.id);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[3],true);
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)&result_type,&this->super_CompilerGLSL,*pmVar10,true);
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,&expr,(char (*) [2])0x2ba3f5,&atomic_op,
                 (char (*) [2])0x2d210e,&pSVar8->dynamic_index,&pSVar8->static_index,
                 (char (*) [3])0x2d07c3,&local_90,(char (*) [3])0x2d07c3,(string *)&result_type,
                 (char (*) [3])0x2b977c);
      if ((undefined1 *)CONCAT44(uStack_4c,result_type) != local_40) {
        operator_delete((undefined1 *)CONCAT44(uStack_4c,result_type));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p == &expr.field_2) goto LAB_001bac73;
    }
    goto LAB_001bac6e;
  default:
    CompilerGLSL::to_expression_abi_cxx11_
              (&expr,&this->super_CompilerGLSL,ops[(ulong)(op == OpAtomicCompareExchange) + 5],true)
    ;
    ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
    paVar1 = &expr.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != paVar1) {
      operator_delete(expr._M_dataplus._M_p);
    }
    if (0xf < op - OpAtomicLoad) {
switchD_001bacff_caseD_4:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Unknown atomic opcode.");
LAB_001bb19f:
      *(undefined ***)this_00 = &PTR__runtime_error_0035bd08;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&switchD_001bacff::switchdataD_002bb970 +
           (long)(int)(&switchD_001bacff::switchdataD_002bb970)[uVar9]);
    switch(uVar9) {
    case 0:
      goto switchD_001baa38_caseD_0;
    case 1:
      goto switchD_001baa38_caseD_1;
    case 2:
      atomic_op = "InterlockedExchange";
      break;
    case 3:
      if (length < 8) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(this_00,"Not enough data for opcode.");
        goto LAB_001bb19f;
      }
      atomic_op = "InterlockedCompareExchange";
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,ops[7],true);
      join<std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                (&expr,(spirv_cross *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d07c3,
                 (char (*) [3])&value_expr,in_R8);
      ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p != paVar1) {
        operator_delete(expr._M_dataplus._M_p);
      }
      puVar12 = (undefined1 *)
                CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12 != &local_90.field_2) goto LAB_001bb151;
      break;
    default:
      goto switchD_001bacff_caseD_4;
    case 7:
      atomic_op = "InterlockedAdd";
      break;
    case 8:
      atomic_op = "InterlockedAdd";
      CompilerGLSL::enclose_expression(&local_90,&this->super_CompilerGLSL,&value_expr);
      join<char_const(&)[2],std::__cxx11::string>
                (&expr,(spirv_cross *)0x2b8eb8,(char (*) [2])&local_90,ts_1);
      ::std::__cxx11::string::operator=((string *)&value_expr,(string *)&expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p != paVar1) {
        operator_delete(expr._M_dataplus._M_p);
      }
      puVar12 = (undefined1 *)
                CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12 != &local_90.field_2) {
LAB_001bb151:
        operator_delete(puVar12);
      }
      break;
    case 9:
    case 10:
      atomic_op = "InterlockedMin";
      break;
    case 0xb:
    case 0xc:
      atomic_op = "InterlockedMax";
      break;
    case 0xd:
      atomic_op = "InterlockedAnd";
      break;
    case 0xe:
      atomic_op = "InterlockedOr";
      break;
    case 0xf:
      atomic_op = "InterlockedXor";
    }
    goto LAB_001baa94;
  case 5:
    pcVar11 = "1";
    break;
  case 6:
    pcVar11 = "-1";
  }
  atomic_op = "InterlockedAdd";
  ::std::__cxx11::string::_M_replace
            ((ulong)&value_expr,0,(char *)value_expr._M_string_length,(ulong)pcVar11);
LAB_001baa94:
  result_type = *ops;
  uVar9 = (ulong)result_type;
  id = ops[1];
  expr._M_dataplus._M_p = (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)expr._M_dataplus._M_p,ops + 1);
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar9);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&expr,this,pSVar6,&local_90,0);
  CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,&expr,(char (*) [2])0x2d3bdb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  pSVar7 = Compiler::expression_type((Compiler *)this,ops[2]);
  id_00 = ops[2];
  uVar9 = (ulong)id_00;
  if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar9].type == TypeAccessChain)) {
    pSVar8 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2 + uVar9);
    if (pSVar7->storage == StorageClassImage) {
      id_00 = ops[2];
      goto LAB_001bab80;
    }
    expr._M_dataplus._M_p = (pointer)&expr.field_2;
    pcVar3 = (pSVar8->base)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&expr,pcVar3,pcVar3 + (pSVar8->base)._M_string_length);
    bVar4 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationNonUniform);
    if (bVar4) {
      CompilerGLSL::convert_non_uniform_expression
                (&this->super_CompilerGLSL,&expr,(pSVar8->super_IVariant).self.id);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&,int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&expr,(char (*) [2])0x2ba3f5,&atomic_op,
               (char (*) [2])0x2d210e,&pSVar8->dynamic_index,&pSVar8->static_index,
               (char (*) [3])0x2d07c3,&value_expr,(char (*) [3])0x2d07c3,&local_90,
               (char (*) [3])0x2b977c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != &expr.field_2) {
      operator_delete(expr._M_dataplus._M_p);
    }
    expr_type = UInt;
  }
  else {
LAB_001bab80:
    CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,id_00);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
    CompilerGLSL::
    statement<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,&atomic_op,(char (*) [2])0x2d210e,&expr,
               (char (*) [3])0x2d07c3,&value_expr,(char (*) [3])0x2d07c3,&local_90,
               (char (*) [3])0x2b977c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p != &expr.field_2) {
      operator_delete(expr._M_dataplus._M_p);
    }
    expr_type = pSVar7->basetype;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_90,this,(ulong)id,1);
  CompilerGLSL::bitcast_expression(&expr,&this->super_CompilerGLSL,pSVar6,expr_type,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  local_90._M_dataplus._M_p._0_1_ = 1;
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,id,&expr,&result_type,(bool *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
LAB_001bac6e:
    operator_delete(expr._M_dataplus._M_p);
  }
LAB_001bac73:
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value_expr._M_dataplus._M_p != &value_expr.field_2) {
    operator_delete(value_expr._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_atomic(const uint32_t *ops, uint32_t length, spv::Op op)
{
	const char *atomic_op = nullptr;

	string value_expr;
	if (op != OpAtomicIDecrement && op != OpAtomicIIncrement && op != OpAtomicLoad && op != OpAtomicStore)
		value_expr = to_expression(ops[op == OpAtomicCompareExchange ? 6 : 5]);

	bool is_atomic_store = false;

	switch (op)
	{
	case OpAtomicIIncrement:
		atomic_op = "InterlockedAdd";
		value_expr = "1";
		break;

	case OpAtomicIDecrement:
		atomic_op = "InterlockedAdd";
		value_expr = "-1";
		break;

	case OpAtomicLoad:
		atomic_op = "InterlockedAdd";
		value_expr = "0";
		break;

	case OpAtomicISub:
		atomic_op = "InterlockedAdd";
		value_expr = join("-", enclose_expression(value_expr));
		break;

	case OpAtomicSMin:
	case OpAtomicUMin:
		atomic_op = "InterlockedMin";
		break;

	case OpAtomicSMax:
	case OpAtomicUMax:
		atomic_op = "InterlockedMax";
		break;

	case OpAtomicAnd:
		atomic_op = "InterlockedAnd";
		break;

	case OpAtomicOr:
		atomic_op = "InterlockedOr";
		break;

	case OpAtomicXor:
		atomic_op = "InterlockedXor";
		break;

	case OpAtomicIAdd:
		atomic_op = "InterlockedAdd";
		break;

	case OpAtomicExchange:
		atomic_op = "InterlockedExchange";
		break;

	case OpAtomicStore:
		atomic_op = "InterlockedExchange";
		is_atomic_store = true;
		break;

	case OpAtomicCompareExchange:
		if (length < 8)
			SPIRV_CROSS_THROW("Not enough data for opcode.");
		atomic_op = "InterlockedCompareExchange";
		value_expr = join(to_expression(ops[7]), ", ", value_expr);
		break;

	default:
		SPIRV_CROSS_THROW("Unknown atomic opcode.");
	}

	if (is_atomic_store)
	{
		auto &data_type = expression_type(ops[0]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[0]);

		auto &tmp_id = extra_sub_expressions[ops[0]];
		if (!tmp_id)
		{
			tmp_id = ir.increase_bound_by(1);
			emit_uninitialized_temporary_expression(get_pointee_type(data_type).self, tmp_id);
		}

		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[0]), ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
		else
		{
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			// RWByteAddress buffer is always uint in its underlying type.
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ",
			          to_expression(ops[3]), ", ", to_expression(tmp_id), ");");
		}
	}
	else
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		forced_temporaries.insert(ops[1]);

		auto &type = get<SPIRType>(result_type);
		statement(variable_decl(type, to_name(id)), ";");

		auto &data_type = expression_type(ops[2]);
		auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
		SPIRType::BaseType expr_type;
		if (data_type.storage == StorageClassImage || !chain)
		{
			statement(atomic_op, "(", to_non_uniform_aware_expression(ops[2]), ", ", value_expr, ", ", to_name(id), ");");
			expr_type = data_type.basetype;
		}
		else
		{
			// RWByteAddress buffer is always uint in its underlying type.
			string base = chain->base;
			if (has_decoration(chain->self, DecorationNonUniform))
				convert_non_uniform_expression(base, chain->self);
			expr_type = SPIRType::UInt;
			statement(base, ".", atomic_op, "(", chain->dynamic_index, chain->static_index, ", ", value_expr,
			          ", ", to_name(id), ");");
		}

		auto expr = bitcast_expression(type, expr_type, to_name(id));
		set<SPIRExpression>(id, expr, result_type, true);
	}
	flush_all_atomic_capable_variables();
}